

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O1

string * __thiscall
FileWriter::buildFilename_abi_cxx11_(string *__return_storage_ptr__,FileWriter *this,time_t t)

{
  char *__format;
  char *__s;
  tm *__tp;
  size_t sVar1;
  value_type_conflict1 *__val;
  time_t local_28;
  
  local_28 = t;
  __s = (char *)operator_new(0x100);
  memset(__s,0,0x100);
  __format = (this->pattern_)._M_dataplus._M_p;
  __tp = gmtime(&local_28);
  sVar1 = strftime(__s,0x100,__format,__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  operator_delete(__s,0x100);
  return __return_storage_ptr__;
}

Assistant:

std::string FileWriter::buildFilename(time_t t) {
  std::vector<char> tsbuf(256);
  auto len = strftime(
    tsbuf.data(),
    tsbuf.size(),
    pattern_.c_str(),
    gmtime(&t));
  return std::string(tsbuf.data(), len);
}